

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O2

Curl_addrinfo * Curl_he2ai(hostent *he,int port)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Curl_addrinfo *pCVar4;
  char *pcVar5;
  sockaddr *psVar6;
  Curl_addrinfo *cahead;
  long lVar7;
  curl_socklen_t cVar8;
  Curl_addrinfo *pCVar9;
  
  if (he == (hostent *)0x0) {
    cahead = (Curl_addrinfo *)0x0;
  }
  else {
    cahead = (Curl_addrinfo *)0x0;
    pCVar9 = (Curl_addrinfo *)0x0;
    for (lVar7 = 0; puVar2 = *(undefined8 **)((long)he->h_addr_list + lVar7),
        puVar2 != (undefined8 *)0x0; lVar7 = lVar7 + 8) {
      cVar8 = 0x10;
      if (he->h_addrtype == 10) {
        cVar8 = 0x1c;
      }
      pCVar4 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
      if (pCVar4 == (Curl_addrinfo *)0x0) goto LAB_0010e399;
      pcVar5 = (*Curl_cstrdup)(he->h_name);
      pCVar4->ai_canonname = pcVar5;
      if (pcVar5 == (char *)0x0) {
LAB_0010e38d:
        (*Curl_cfree)(pCVar4);
LAB_0010e399:
        Curl_freeaddrinfo(cahead);
        return (Curl_addrinfo *)0x0;
      }
      psVar6 = (sockaddr *)(*Curl_ccalloc)(1,(size_t)cVar8);
      pCVar4->ai_addr = psVar6;
      if (psVar6 == (sockaddr *)0x0) {
        (*Curl_cfree)(pCVar4->ai_canonname);
        goto LAB_0010e38d;
      }
      if (cahead == (Curl_addrinfo *)0x0) {
        cahead = pCVar4;
      }
      if (pCVar9 != (Curl_addrinfo *)0x0) {
        pCVar9->ai_next = pCVar4;
      }
      iVar1 = he->h_addrtype;
      pCVar4->ai_family = iVar1;
      pCVar4->ai_socktype = 1;
      pCVar4->ai_addrlen = cVar8;
      if (iVar1 == 10) {
        uVar3 = puVar2[1];
        *(undefined8 *)(psVar6->sa_data + 6) = *puVar2;
        psVar6[1].sa_family = (short)uVar3;
        psVar6[1].sa_data[0] = (char)((ulong)uVar3 >> 0x10);
        psVar6[1].sa_data[1] = (char)((ulong)uVar3 >> 0x18);
        psVar6[1].sa_data[2] = (char)((ulong)uVar3 >> 0x20);
        psVar6[1].sa_data[3] = (char)((ulong)uVar3 >> 0x28);
        psVar6[1].sa_data[4] = (char)((ulong)uVar3 >> 0x30);
        psVar6[1].sa_data[5] = (char)((ulong)uVar3 >> 0x38);
LAB_0010e35c:
        psVar6->sa_family = (sa_family_t)he->h_addrtype;
        *(ushort *)psVar6->sa_data = (ushort)port << 8 | (ushort)port >> 8;
      }
      else if (iVar1 == 2) {
        *(undefined4 *)(psVar6->sa_data + 2) = *(undefined4 *)puVar2;
        goto LAB_0010e35c;
      }
      pCVar9 = pCVar4;
    }
  }
  return cahead;
}

Assistant:

Curl_addrinfo *
Curl_he2ai(const struct hostent *he, int port)
{
  Curl_addrinfo *ai;
  Curl_addrinfo *prevai = NULL;
  Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;
  char *curr;

  if(!he)
    /* no input == no output! */
    return NULL;

  DEBUGASSERT((he->h_name != NULL) && (he->h_addr_list != NULL));

  for(i = 0; (curr = he->h_addr_list[i]) != NULL; i++) {

    size_t ss_size;
#ifdef ENABLE_IPV6
    if(he->h_addrtype == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
    else
#endif
      ss_size = sizeof(struct sockaddr_in);

    ai = calloc(1, sizeof(Curl_addrinfo));
    if(!ai) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    ai->ai_canonname = strdup(he->h_name);
    if(!ai->ai_canonname) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai);
      break;
    }
    ai->ai_addr = calloc(1, ss_size);
    if(!ai->ai_addr) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai->ai_canonname);
      free(ai);
      break;
    }

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = he->h_addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch(ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr->sin_addr, curr, sizeof(struct in_addr));
      addr->sin_family = (CURL_SA_FAMILY_T)(he->h_addrtype);
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef ENABLE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr6->sin6_addr, curr, sizeof(struct in6_addr));
      addr6->sin6_family = (CURL_SA_FAMILY_T)(he->h_addrtype);
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }

  return firstai;
}